

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O2

int __thiscall Heuristics::evaluateStateAstar(Heuristics *this,Table currentState)

{
  Cell *pCVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  int i;
  long lVar8;
  int iVar9;
  int j;
  long lVar10;
  Table *pTVar11;
  int iVar12;
  int j_1;
  Table *pTVar13;
  
  pTVar13 = &currentState;
  iVar7 = 0;
  iVar12 = 0;
  for (lVar8 = 0; pTVar11 = &currentState, lVar8 != 3; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      pCVar1 = pTVar13->table[0] + lVar10;
      cVar3 = Cell::getNumber(pCVar1);
      if (cVar3 != ' ') {
        cVar3 = Cell::getNumber(pCVar1);
        iVar12 = cVar3 + -0x30;
        uVar5 = (int)cVar3 - 0x31;
        uVar6 = (short)uVar5 >> 0xf;
        iVar4 = (int)(short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) / -3) + (int)lVar8;
        iVar2 = -iVar4;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        iVar9 = (int)lVar10 - (int)(short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) % 3);
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        iVar7 = iVar4 + iVar7 + iVar2;
      }
      iVar4 = (iVar12 + -1) / -3 + (int)lVar8;
      iVar2 = -iVar4;
      if (0 < iVar4) {
        iVar2 = iVar4;
      }
      iVar9 = (int)lVar10 - (iVar12 + -1) % 3;
      iVar4 = -iVar9;
      if (0 < iVar9) {
        iVar4 = iVar9;
      }
      iVar7 = iVar7 + iVar4 + iVar2;
    }
    pTVar13 = (Table *)(pTVar13->table + 1);
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      pCVar1 = pTVar11->table[0] + lVar10;
      cVar3 = Cell::getNumber(pCVar1);
      if (cVar3 != ' ') {
        cVar3 = Cell::getNumber(pCVar1);
        iVar12 = cVar3 + -0x30;
        uVar5 = (int)cVar3 - 0x31;
        uVar6 = (short)uVar5 >> 0xf;
        iVar4 = (int)(short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) / -3) + (int)lVar8;
        iVar2 = -iVar4;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        iVar9 = (int)lVar10 - (int)(short)((int)((uint)uVar6 << 0x10 | uVar5 & 0xffff) % 3);
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        iVar7 = iVar4 + iVar7 + iVar2;
      }
      iVar4 = (iVar12 + -1) / -3 + (int)lVar8;
      iVar2 = -iVar4;
      if (0 < iVar4) {
        iVar2 = iVar4;
      }
      iVar9 = (int)lVar10 - (iVar12 + -1) % 3;
      iVar4 = -iVar9;
      if (0 < iVar9) {
        iVar4 = iVar9;
      }
      iVar7 = iVar7 + iVar4 + iVar2;
    }
    pTVar11 = (Table *)(pTVar11->table + 1);
  }
  return iVar7;
}

Assistant:

int Heuristics::evaluateStateAstar(Table currentState) {
    int distance = 0;
    Table initialTable = Table();
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    return distance;
}